

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImmutableList.cpp
# Opt level: O0

void __thiscall
regex::ImmutableStringBuilder<8>::AppendUInt64(ImmutableStringBuilder<8> *this,uint64 value)

{
  code *pcVar1;
  bool bVar2;
  HRESULT HVar3;
  undefined4 *puVar4;
  WCHAR local_48 [2];
  HRESULT hr;
  WCHAR buffer [21];
  uint64 value_local;
  ImmutableStringBuilder<8> *this_local;
  
  unique0x100000eb = value;
  HVar3 = StringCchPrintfW(local_48,0x15,L"%llu",value);
  if (HVar3 < 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ImmutableList.cpp"
                       ,0x25,"(((HRESULT)(hr) >= 0))","StringCchPrintfW");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (HVar3 < 0) {
    Js::Throw::OutOfMemory();
  }
  AppendWithCopy(this,local_48);
  return;
}

Assistant:

void regex::ImmutableStringBuilder<chunkSize>::AppendUInt64(uint64 value)
{
    WCHAR buffer[21]; // 18,446,744,073,709,551,615 w.o ',' + \0
    HRESULT hr = S_OK;
    hr = StringCchPrintfW(buffer, _countof(buffer), _u("%llu"), value);
    AssertMsg(SUCCEEDED(hr), "StringCchPrintfW");
    if (FAILED(hr) )
    {
        Js::Throw::OutOfMemory();
    }

    // append to the stringBuilder string
    this->AppendWithCopy(buffer);
}